

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_huffman_code_lengths(uint *lengths,uint *frequencies,size_t numcodes,uint maxbitlen)

{
  BPMNode *pBVar1;
  BPMNode *pBVar2;
  BPMNode *pBVar3;
  BPMNode *pBVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  BPMNode *leaves;
  ulong uVar8;
  BPMNode *pBVar9;
  BPMNode **ppBVar10;
  BPMNode **ppBVar11;
  ulong uVar12;
  uint uVar13;
  BPMNode *pBVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong numpresent;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  ulong uVar24;
  int iVar26;
  undefined1 auVar25 [16];
  BPMLists lists;
  BPMLists local_80;
  uint *local_48;
  size_t local_40;
  BPMNode *local_38;
  
  uVar15 = 0x50;
  if ((uint)numcodes <= (uint)(1 << ((byte)maxbitlen & 0x1f)) && numcodes != 0) {
    leaves = (BPMNode *)malloc(numcodes * 0x18);
    if (leaves == (BPMNode *)0x0) {
      uVar15 = 0x53;
    }
    else {
      uVar8 = 0;
      numpresent = 0;
      do {
        if (frequencies[uVar8] != 0) {
          leaves[numpresent].weight = frequencies[uVar8];
          leaves[numpresent].index = (uint)uVar8;
          numpresent = numpresent + 1;
        }
        uVar8 = uVar8 + 1;
      } while ((uVar8 & 0xffffffff) != numcodes);
      uVar15 = 0;
      memset(lengths,0,numcodes << 2);
      if (numpresent == 1) {
        uVar13 = leaves->index;
        lengths[uVar13] = 1;
        lengths[(ulong)uVar13 == 0] = 1;
      }
      else if (numpresent == 0) {
        lengths[0] = 1;
        lengths[1] = 1;
        uVar15 = 0;
      }
      else {
        local_40 = numpresent * 0x18;
        local_48 = lengths;
        pBVar9 = (BPMNode *)malloc(local_40);
        uVar8 = 1;
        bVar6 = false;
        do {
          bVar17 = bVar6;
          pBVar14 = leaves;
          pBVar3 = pBVar9;
          if (!bVar17) {
            pBVar14 = pBVar9;
            pBVar3 = leaves;
          }
          uVar12 = uVar8 * 2;
          uVar19 = 0;
          do {
            uVar24 = uVar19 + uVar8;
            if (numpresent <= uVar19 + uVar8) {
              uVar24 = numpresent;
            }
            uVar18 = uVar19 + uVar12;
            pBVar4 = pBVar14;
            uVar20 = uVar19;
            uVar21 = uVar24;
            uVar22 = numpresent;
            if (uVar18 < numpresent) {
              uVar22 = uVar18;
            }
            for (; uVar19 < uVar22; uVar19 = uVar19 + 1) {
              if ((uVar20 < uVar24) &&
                 ((uVar22 <= uVar21 || (pBVar3[uVar20].weight <= pBVar3[uVar21].weight)))) {
                uVar16 = uVar20 + 1;
              }
              else {
                uVar16 = uVar20;
                uVar20 = uVar21;
                uVar21 = uVar21 + 1;
              }
              uVar5 = *(undefined4 *)&pBVar3[uVar20].field_0x14;
              pBVar4->in_use = pBVar3[uVar20].in_use;
              *(undefined4 *)&pBVar4->field_0x14 = uVar5;
              pBVar1 = pBVar3 + uVar20;
              uVar15 = pBVar1->index;
              pBVar2 = pBVar1->tail;
              pBVar4->weight = pBVar1->weight;
              pBVar4->index = uVar15;
              pBVar4->tail = pBVar2;
              pBVar4 = pBVar4 + 1;
              uVar20 = uVar16;
            }
            pBVar14 = pBVar14 + uVar8 * 2;
            uVar19 = uVar18;
          } while (uVar18 < numpresent);
          uVar8 = uVar12;
          bVar6 = (bool)(bVar17 ^ 1);
        } while (uVar12 < numpresent);
        local_38 = leaves;
        if (local_40 != 0 && !bVar17) {
          memcpy(leaves,pBVar9,local_40);
        }
        free(pBVar9);
        local_80.memsize = (maxbitlen + 1) * maxbitlen * 2;
        uVar8 = (ulong)local_80.memsize;
        local_80.nextfree = 0;
        local_80.numfree = local_80.memsize;
        local_80.listsize = maxbitlen;
        pBVar9 = (BPMNode *)malloc(uVar8 * 0x18);
        local_80.memory = pBVar9;
        ppBVar10 = (BPMNode **)malloc(uVar8 * 8);
        local_80.freelist = ppBVar10;
        ppBVar11 = (BPMNode **)malloc((ulong)maxbitlen << 3);
        local_80.chains0 = ppBVar11;
        local_80.chains1 = (BPMNode **)malloc((ulong)maxbitlen << 3);
        iVar26 = (int)((ulong)pBVar9 >> 0x20);
        auVar25._0_4_ = -(uint)(iVar26 == 0 && (int)pBVar9 == 0);
        auVar25._4_4_ = -(uint)((int)ppBVar10 == 0 && (int)((ulong)ppBVar10 >> 0x20) == 0);
        auVar25._8_4_ = -(uint)((int)((ulong)ppBVar11 >> 0x20) == 0 && (int)ppBVar11 == 0);
        auVar25._12_4_ =
             -(uint)((int)local_80.chains1 == 0 && (int)((ulong)local_80.chains1 >> 0x20) == 0);
        iVar7 = movmskps((int)local_80.chains1,auVar25);
        uVar15 = 0x53;
        if (iVar7 == 0) {
          if (uVar8 != 0) {
            uVar19 = 0;
            uVar24 = 1;
            uVar12 = 0;
            auVar23._8_4_ = (int)pBVar9;
            auVar23._0_8_ = pBVar9;
            auVar23._12_4_ = iVar26;
            do {
              ppBVar10[uVar12] =
                   (BPMNode *)
                   ((long)&pBVar9[uVar19 & 0xffffffff].weight + ((uVar19 >> 0x20) * 0x18 << 0x20));
              (ppBVar10 + uVar12)[1] =
                   (BPMNode *)
                   (((uVar24 >> 0x20) * 0x18 << 0x20) + (uVar24 & 0xffffffff) * 0x18 + auVar23._8_8_
                   );
              uVar12 = uVar12 + 2;
              uVar19 = uVar19 + 2;
              uVar24 = uVar24 + 2;
            } while (uVar8 != uVar12);
          }
          bpmnode_create(&local_80,leaves->weight,1,(BPMNode *)0x0);
          bpmnode_create(&local_80,leaves[1].weight,2,(BPMNode *)0x0);
          if ((ulong)local_80.listsize != 0) {
            uVar8 = 0;
            do {
              local_80.chains0[uVar8] = local_80.memory;
              local_80.chains1[uVar8] = local_80.memory + 1;
              uVar8 = uVar8 + 1;
            } while (local_80.listsize != uVar8);
          }
          uVar8 = numpresent * 2 - 2;
          if (uVar8 != 2) {
            uVar12 = 2;
            do {
              boundaryPM(&local_80,leaves,numpresent,maxbitlen - 1,(int)uVar12);
              uVar12 = (ulong)((int)uVar12 + 1);
            } while (uVar8 != uVar12);
          }
          uVar15 = 0;
          for (pBVar9 = local_80.chains1[maxbitlen - 1]; pBVar9 != (BPMNode *)0x0;
              pBVar9 = pBVar9->tail) {
            if (pBVar9->index != 0) {
              uVar8 = 0;
              do {
                local_48[leaves[uVar8].index] = local_48[leaves[uVar8].index] + 1;
                uVar13 = (int)uVar8 + 1;
                uVar8 = (ulong)uVar13;
              } while (uVar13 != pBVar9->index);
            }
          }
        }
        ppBVar10 = local_80.chains1;
        free(local_80.memory);
        free(local_80.freelist);
        free(local_80.chains0);
        free(ppBVar10);
      }
      free(leaves);
    }
  }
  return uVar15;
}

Assistant:

unsigned lodepng_huffman_code_lengths(unsigned* lengths, const unsigned* frequencies,
                                      size_t numcodes, unsigned maxbitlen) {
  unsigned error = 0;
  unsigned i;
  size_t numpresent = 0; /*number of symbols with non-zero frequency*/
  BPMNode* leaves; /*the symbols, only those with > 0 frequency*/

  if(numcodes == 0) return 80; /*error: a tree of 0 symbols is not supposed to be made*/
  if((1u << maxbitlen) < (unsigned)numcodes) return 80; /*error: represent all symbols*/

  leaves = (BPMNode*)lodepng_malloc(numcodes * sizeof(*leaves));
  if(!leaves) return 83; /*alloc fail*/

  for(i = 0; i != numcodes; ++i) {
    if(frequencies[i] > 0) {
      leaves[numpresent].weight = (int)frequencies[i];
      leaves[numpresent].index = i;
      ++numpresent;
    }
  }

  lodepng_memset(lengths, 0, numcodes * sizeof(*lengths));

  /*ensure at least two present symbols. There should be at least one symbol
  according to RFC 1951 section 3.2.7. Some decoders incorrectly require two. To
  make these work as well ensure there are at least two symbols. The
  Package-Merge code below also doesn't work correctly if there's only one
  symbol, it'd give it the theoretical 0 bits but in practice zlib wants 1 bit*/
  if(numpresent == 0) {
    lengths[0] = lengths[1] = 1; /*note that for RFC 1951 section 3.2.7, only lengths[0] = 1 is needed*/
  } else if(numpresent == 1) {
    lengths[leaves[0].index] = 1;
    lengths[leaves[0].index == 0 ? 1 : 0] = 1;
  } else {
    BPMLists lists;
    BPMNode* node;

    bpmnode_sort(leaves, numpresent);

    lists.listsize = maxbitlen;
    lists.memsize = 2 * maxbitlen * (maxbitlen + 1);
    lists.nextfree = 0;
    lists.numfree = lists.memsize;
    lists.memory = (BPMNode*)lodepng_malloc(lists.memsize * sizeof(*lists.memory));
    lists.freelist = (BPMNode**)lodepng_malloc(lists.memsize * sizeof(BPMNode*));
    lists.chains0 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    lists.chains1 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    if(!lists.memory || !lists.freelist || !lists.chains0 || !lists.chains1) error = 83; /*alloc fail*/

    if(!error) {
      for(i = 0; i != lists.memsize; ++i) lists.freelist[i] = &lists.memory[i];

      bpmnode_create(&lists, leaves[0].weight, 1, 0);
      bpmnode_create(&lists, leaves[1].weight, 2, 0);

      for(i = 0; i != lists.listsize; ++i) {
        lists.chains0[i] = &lists.memory[0];
        lists.chains1[i] = &lists.memory[1];
      }

      /*each boundaryPM call adds one chain to the last list, and we need 2 * numpresent - 2 chains.*/
      for(i = 2; i != 2 * numpresent - 2; ++i) boundaryPM(&lists, leaves, numpresent, (int)maxbitlen - 1, (int)i);

      for(node = lists.chains1[maxbitlen - 1]; node; node = node->tail) {
        for(i = 0; i != node->index; ++i) ++lengths[leaves[i].index];
      }
    }

    lodepng_free(lists.memory);
    lodepng_free(lists.freelist);
    lodepng_free(lists.chains0);
    lodepng_free(lists.chains1);
  }

  lodepng_free(leaves);
  return error;
}